

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_extract.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::StructExtractFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  ScalarFunctionSet *in_RDI;
  string local_288;
  ScalarFunction local_268;
  ScalarFunction local_140;
  
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"struct_extract","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  GetKeyExtractFunction();
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_140);
  local_140.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_019684c8;
  if (local_140.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_140.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_140.function.super__Function_base._M_manager)
              ((_Any_data *)&local_140.function,(_Any_data *)&local_140.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_140.super_BaseScalarFunction);
  GetIndexExtractFunction();
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_268);
  local_268.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_019684c8;
  if (local_268.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_268.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_268.function.super__Function_base._M_manager)
              ((_Any_data *)&local_268.function,(_Any_data *)&local_268.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_268.super_BaseScalarFunction);
  return in_RDI;
}

Assistant:

ScalarFunctionSet StructExtractFun::GetFunctions() {
	// the arguments and return types are actually set in the binder function
	ScalarFunctionSet struct_extract_set("struct_extract");
	struct_extract_set.AddFunction(GetKeyExtractFunction());
	struct_extract_set.AddFunction(GetIndexExtractFunction());
	return struct_extract_set;
}